

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void __thiscall
Medicine::Medicine(Medicine *this,int id,int unitePrice,int quantity,bool isSold,string *name,
                  string *companyName,string *arrivalDate,string *expireDate)

{
  this->id = id;
  this->unitePrice = unitePrice;
  this->quantity = quantity;
  this->isSold = isSold;
  std::__cxx11::string::string((string *)&this->name,(string *)name);
  std::__cxx11::string::string((string *)&this->companyName,(string *)companyName);
  std::__cxx11::string::string((string *)&this->arrivalDate,(string *)arrivalDate);
  std::__cxx11::string::string((string *)&this->expireDate,(string *)expireDate);
  return;
}

Assistant:

Medicine(int id, int unitePrice, int quantity, bool isSold, const string &name, const string &companyName,
             const string &arrivalDate, const string &expireDate) : id(id), unitePrice(unitePrice), quantity(quantity),
                                                                    isSold(isSold), name(name),
                                                                    companyName(companyName), arrivalDate(arrivalDate),
                                                                    expireDate(expireDate) {}